

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  bool *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool local_2;
  bool local_1;
  
  if ((this->CurrentLinkType != lt) && (this->CurrentLinkType = lt, this->LinkTypeEnabled == true))
  {
    if (lt == LinkShared) {
      __args = &this->SharedLinkTypeFlag;
      __args_1 = &local_2;
    }
    else {
      if (lt != LinkStatic) {
        return;
      }
      __args = &this->StaticLinkTypeFlag;
      __args_1 = &local_1;
    }
    *__args_1 = false;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,__args,__args_1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.emplace_back(this->StaticLinkTypeFlag, false);
          break;
        case LinkShared:
          this->Items.emplace_back(this->SharedLinkTypeFlag, false);
          break;
        default:
          break;
      }
    }
  }
}